

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void DecodeAperiodicity(double **coded_aperiodicity,int f0_length,int fs,int fft_size,
                       double **aperiodicity)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int number_of_aperiodicities_00;
  int iVar4;
  ulong uVar5;
  double *frequency_axis_00;
  double *coarse_frequency_axis_00;
  double *tmp_aperiodicity;
  int local_5c;
  int i_2;
  double *coarse_aperiodicity;
  int i_1;
  double *coarse_frequency_axis;
  int i;
  double *frequency_axis;
  int number_of_aperiodicities;
  double **aperiodicity_local;
  int fft_size_local;
  int fs_local;
  int f0_length_local;
  double **coded_aperiodicity_local;
  
  anon_unknown.dwarf_20c0::InitializeAperiodicity(f0_length,fft_size,aperiodicity);
  number_of_aperiodicities_00 = GetNumberOfAperiodicities(fs);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(fft_size / 2 + 1);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  frequency_axis_00 = (double *)operator_new__(uVar5);
  for (coarse_frequency_axis._4_4_ = 0; coarse_frequency_axis._4_4_ <= fft_size / 2;
      coarse_frequency_axis._4_4_ = coarse_frequency_axis._4_4_ + 1) {
    frequency_axis_00[coarse_frequency_axis._4_4_] =
         ((double)fs / (double)fft_size) * (double)coarse_frequency_axis._4_4_;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(number_of_aperiodicities_00 + 2);
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  coarse_frequency_axis_00 = (double *)operator_new__(uVar5);
  for (coarse_aperiodicity._4_4_ = 0; coarse_aperiodicity._4_4_ <= number_of_aperiodicities_00;
      coarse_aperiodicity._4_4_ = coarse_aperiodicity._4_4_ + 1) {
    coarse_frequency_axis_00[coarse_aperiodicity._4_4_] = (double)coarse_aperiodicity._4_4_ * 3000.0
    ;
  }
  coarse_frequency_axis_00[number_of_aperiodicities_00 + 1] = (double)fs / 2.0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(number_of_aperiodicities_00 + 2);
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  tmp_aperiodicity = (double *)operator_new__(uVar5);
  *tmp_aperiodicity = -60.0;
  tmp_aperiodicity[number_of_aperiodicities_00 + 1] = -1e-12;
  for (local_5c = 0; local_5c < f0_length; local_5c = local_5c + 1) {
    iVar4 = anon_unknown.dwarf_20c0::CheckVUV
                      (coded_aperiodicity[local_5c],number_of_aperiodicities_00,tmp_aperiodicity);
    if (iVar4 != 1) {
      anon_unknown.dwarf_20c0::GetAperiodicity
                (coarse_frequency_axis_00,tmp_aperiodicity,number_of_aperiodicities_00,
                 frequency_axis_00,fft_size,aperiodicity[local_5c]);
    }
  }
  if (tmp_aperiodicity != (double *)0x0) {
    operator_delete__(tmp_aperiodicity);
  }
  if (coarse_frequency_axis_00 != (double *)0x0) {
    operator_delete__(coarse_frequency_axis_00);
  }
  if (frequency_axis_00 != (double *)0x0) {
    operator_delete__(frequency_axis_00);
  }
  return;
}

Assistant:

void DecodeAperiodicity(const double * const *coded_aperiodicity,
    int f0_length, int fs, int fft_size, double **aperiodicity) {
  InitializeAperiodicity(f0_length, fft_size, aperiodicity);
  int number_of_aperiodicities = GetNumberOfAperiodicities(fs);
  double *frequency_axis = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i)
    frequency_axis[i] = static_cast<double>(fs) / fft_size * i;

  double *coarse_frequency_axis = new double[number_of_aperiodicities + 2];
  for (int i = 0; i <= number_of_aperiodicities; ++i)
    coarse_frequency_axis[i] = i * world::kFrequencyInterval;
  coarse_frequency_axis[number_of_aperiodicities + 1] = fs / 2.0;

  double *coarse_aperiodicity = new double[number_of_aperiodicities + 2];
  coarse_aperiodicity[0] = -60.0;
  coarse_aperiodicity[number_of_aperiodicities + 1] =
    -world::kMySafeGuardMinimum;

  for (int i = 0; i < f0_length; ++i) {
    if (CheckVUV(coded_aperiodicity[i], number_of_aperiodicities,
      coarse_aperiodicity) == 1) continue;
    GetAperiodicity(coarse_frequency_axis, coarse_aperiodicity,
        number_of_aperiodicities, frequency_axis, fft_size, aperiodicity[i]);
  }

  delete[] coarse_aperiodicity;
  delete[] coarse_frequency_axis;
  delete[] frequency_axis;
}